

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareDestinationTexture
          (FunctionalTest *this,bool is_stencil)

{
  GLuint GVar1;
  undefined7 in_register_00000031;
  size_type __new_size;
  GLenum format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = 0x100;
  if ((int)CONCAT71(in_register_00000031,is_stencil) != 0) {
    __new_size = 0x40;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,__new_size);
  format = 0x1903;
  if (is_stencil) {
    format = 0x8d94;
  }
  memset(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,0,__new_size);
  GVar1 = Utils::createAndFill2DTexture
                    ((this->super_TestCase).m_context,8,8,(uint)is_stencil * 4 + 0x822e,format,
                     (uint)!is_stencil + (uint)!is_stencil * 4 + 0x1401,
                     local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return GVar1;
}

Assistant:

GLuint FunctionalTest::prepareDestinationTexture(bool is_stencil)
{
	static const GLuint  n_pixels		 = m_width * m_height;
	GLenum				 format			 = 0;
	GLenum				 internal_format = 0;
	GLuint				 pixel_size		 = 0;
	std::vector<GLubyte> texture_data;
	GLuint				 texture_id   = 0;
	GLuint				 texture_size = 0;
	GLenum				 type		  = 0;

	/* Select size of pixel */
	if (true == is_stencil)
	{
		format			= GL_RED_INTEGER;
		internal_format = GL_R8UI;
		pixel_size		= 1;
		type			= GL_UNSIGNED_BYTE;
	}
	else
	{
		format			= GL_RED;
		internal_format = GL_R32F;
		pixel_size		= 4;
		type			= GL_FLOAT;
	}

	/* Allocate storage */
	texture_size = pixel_size * n_pixels;
	texture_data.resize(texture_size);

	/* Fill texture data */
	memset(&texture_data[0], 0, texture_size);

	/* Create texture */
	texture_id =
		Utils::createAndFill2DTexture(m_context, m_width, m_height, internal_format, format, type, &texture_data[0]);

	/* Done */
	return texture_id;
}